

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::NegativeGroup::init(NegativeGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  BadStateCase *pBVar2;
  BadDrawModeCase *pBVar3;
  NegativeGroup *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x88);
  BadAlignmentCase::BadAlignmentCase
            ((BadAlignmentCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "command_bad_alignment_1","Bad command alignment",1);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  BadAlignmentCase::BadAlignmentCase
            ((BadAlignmentCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "command_bad_alignment_2","Bad command alignment",2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  BadAlignmentCase::BadAlignmentCase
            ((BadAlignmentCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "command_bad_alignment_3","Bad command alignment",3);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  BadBufferRangeCase::BadBufferRangeCase
            ((BadBufferRangeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "command_offset_partially_in_buffer","Command not fully in the buffer range",4);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  BadBufferRangeCase::BadBufferRangeCase
            ((BadBufferRangeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "command_offset_not_in_buffer","Command not in the buffer range",0x14);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  BadBufferRangeCase::BadBufferRangeCase
            ((BadBufferRangeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "command_offset_not_in_buffer_unsigned32_wrap","Command not in the buffer range",
             0xfffffffc);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x88);
  BadBufferRangeCase::BadBufferRangeCase
            ((BadBufferRangeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "command_offset_not_in_buffer_signed32_wrap","Command not in the buffer range",
             0x7ffffffc);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pBVar2 = (BadStateCase *)operator_new(0x80);
  BadStateCase::BadStateCase
            (pBVar2,(this->super_TestCaseGroup).m_context,"client_vertex_attrib_array",
             "Vertex attrib array in the client memory",CASE_CLIENT_BUFFER_VERTEXATTR);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar2);
  pBVar2 = (BadStateCase *)operator_new(0x80);
  BadStateCase::BadStateCase
            (pBVar2,(this->super_TestCaseGroup).m_context,"client_command_array",
             "Command array in the client memory",CASE_CLIENT_BUFFER_COMMAND);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar2);
  pBVar2 = (BadStateCase *)operator_new(0x80);
  BadStateCase::BadStateCase
            (pBVar2,(this->super_TestCaseGroup).m_context,"default_vao","Use with default vao",
             CASE_DEFAULT_VAO);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar2);
  pBVar3 = (BadDrawModeCase *)operator_new(0x80);
  BadDrawModeCase::BadDrawModeCase
            (pBVar3,(this->super_TestCaseGroup).m_context,"invalid_mode_draw_arrays",
             "Call DrawArraysIndirect with bad mode",DRAW_ARRAYS);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar3);
  pBVar3 = (BadDrawModeCase *)operator_new(0x80);
  BadDrawModeCase::BadDrawModeCase
            (pBVar3,(this->super_TestCaseGroup).m_context,"invalid_mode_draw_elements",
             "Call DrawelementsIndirect with bad mode",DRAW_ELEMENTS);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar3);
  pBVar3 = (BadDrawModeCase *)operator_new(0x80);
  BadDrawModeCase::BadDrawModeCase
            (pBVar3,(this->super_TestCaseGroup).m_context,"invalid_type_draw_elements",
             "Call DrawelementsIndirect with bad type",DRAW_ELEMENTS_BAD_INDEX);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar3);
  return extraout_EAX;
}

Assistant:

void NegativeGroup::init (void)
{
	// invalid alignment
	addChild(new BadAlignmentCase	(m_context, "command_bad_alignment_1",								"Bad command alignment",					1));
	addChild(new BadAlignmentCase	(m_context, "command_bad_alignment_2",								"Bad command alignment",					2));
	addChild(new BadAlignmentCase	(m_context, "command_bad_alignment_3",								"Bad command alignment",					3));

	// command only partially or not at all in the buffer
	addChild(new BadBufferRangeCase	(m_context, "command_offset_partially_in_buffer",					"Command not fully in the buffer range",	BadBufferRangeCase::CommandSize - 16));
	addChild(new BadBufferRangeCase	(m_context, "command_offset_not_in_buffer",							"Command not in the buffer range",			BadBufferRangeCase::CommandSize));
	addChild(new BadBufferRangeCase	(m_context, "command_offset_not_in_buffer_unsigned32_wrap",			"Command not in the buffer range",			0xFFFFFFFC));
	addChild(new BadBufferRangeCase	(m_context, "command_offset_not_in_buffer_signed32_wrap",			"Command not in the buffer range",			0x7FFFFFFC));

	// use with client data and default vao
	addChild(new BadStateCase		(m_context, "client_vertex_attrib_array",							"Vertex attrib array in the client memory",	BadStateCase::CASE_CLIENT_BUFFER_VERTEXATTR));
	addChild(new BadStateCase		(m_context, "client_command_array",									"Command array in the client memory",		BadStateCase::CASE_CLIENT_BUFFER_COMMAND));
	addChild(new BadStateCase		(m_context, "default_vao",											"Use with default vao",						BadStateCase::CASE_DEFAULT_VAO));

	// invalid mode & type
	addChild(new BadDrawModeCase	(m_context, "invalid_mode_draw_arrays",								"Call DrawArraysIndirect with bad mode",	BadDrawModeCase::DRAW_ARRAYS));
	addChild(new BadDrawModeCase	(m_context, "invalid_mode_draw_elements",							"Call DrawelementsIndirect with bad mode",	BadDrawModeCase::DRAW_ELEMENTS));
	addChild(new BadDrawModeCase	(m_context, "invalid_type_draw_elements",							"Call DrawelementsIndirect with bad type",	BadDrawModeCase::DRAW_ELEMENTS_BAD_INDEX));
}